

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint Register;
  int iVar5;
  
  uVar2 = Insn >> 6 & 3;
  iVar5 = ((Insn >> 5 & 1) != 0) + 1;
  uVar3 = Insn >> 4 & 1;
  if (uVar2 == 2) {
    uVar2 = uVar3 << 3;
  }
  else if (uVar2 == 3) {
    uVar2 = 0x10;
    if (uVar3 == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar2 = uVar3 << (char)uVar2 + 2;
  }
  uVar4 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar3 = Insn & 0xf;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar4]);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar5 + uVar4 & 0x1f]);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar4 + iVar5 * 2 & 0x1f]);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar5 * 3 + uVar4 & 0x1f]);
  uVar1 = GPRDecoderTable[Insn >> 0x10 & 0xf];
  if (uVar3 != 0xf) {
    MCOperand_CreateReg0(Inst,(uint)uVar1);
  }
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  uVar2 = 0;
  if (uVar3 != 0xd) {
    if (uVar3 == 0xf) {
      return MCDisassembler_Success;
    }
    uVar2 = (uint)GPRDecoderTable[uVar3];
  }
  MCOperand_CreateReg0(Inst,uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, size, inc, align;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	size = fieldFromInstruction_4(Insn, 6, 2);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;
	align = fieldFromInstruction_4(Insn, 4, 1);

	if (size == 0x3) {
		if (align == 0)
			return MCDisassembler_Fail;
		align = 16;
	} else {
		if (size == 2) {
			align *= 8;
		} else {
			size = 1 << size;
			align *= 4 * size;
		}
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}